

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t
exr_encoding_choose_default_routines
          (exr_const_context_t ctxt,int part_index,exr_encode_pipeline_t *encode)

{
  int iVar1;
  int iVar2;
  internal_exr_pack_fn p_Var3;
  exr_encode_pipeline_t *in_RDX;
  uint in_ESI;
  exr_const_context_t in_RDI;
  bool bVar4;
  exr_const_priv_part_t part;
  int32_t isdeep;
  exr_const_context_t in_stack_ffffffffffffffd0;
  exr_const_context_t c;
  exr_result_t local_4;
  
  if (in_RDI == (exr_const_context_t)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffd0);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      c = (exr_const_context_t)in_RDI->parts[(int)in_ESI];
      if (in_RDX == (exr_encode_pipeline_t *)0x0) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(c);
        }
        local_4 = (*in_RDI->standard_error)(in_RDI,3);
      }
      else if ((in_RDX->context == in_RDI) && (in_RDX->part_index == in_ESI)) {
        iVar1._0_1_ = c->has_nonimage_data;
        iVar1._1_1_ = c->is_multipart;
        iVar1._2_1_ = c->strict_header;
        iVar1._3_1_ = c->silent_header;
        bVar4 = true;
        if (iVar1 != 2) {
          iVar2._0_1_ = c->has_nonimage_data;
          iVar2._1_1_ = c->is_multipart;
          iVar2._2_1_ = c->strict_header;
          iVar2._3_1_ = c->silent_header;
          bVar4 = iVar2 == 3;
        }
        p_Var3 = internal_exr_match_encode(in_RDX,(uint)bVar4);
        in_RDX->convert_and_pack_fn = (_func_exr_result_t__exr_encode_pipeline_ptr *)p_Var3;
        if ((int)c->output_file_offset != 0) {
          in_RDX->compress_fn = exr_compress_chunk;
        }
        in_RDX->yield_until_ready_fn = default_yield;
        in_RDX->write_fn = default_write_chunk;
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(c);
        }
        local_4 = 0;
      }
      else {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(c);
        }
        local_4 = (*in_RDI->print_error)
                            (in_RDI,3,
                             "Cross-wired request for default routines from different context / part"
                            );
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_encoding_choose_default_routines (
    exr_const_context_t ctxt, int part_index, exr_encode_pipeline_t* encode)
{
    int32_t isdeep = 0;
    EXR_LOCK_WRITE_AND_DEFINE_PART (part_index);
    if (!encode)
        return EXR_UNLOCK_WRITE_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT));

    if (encode->context != ctxt || encode->part_index != part_index)
        return EXR_UNLOCK_WRITE_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Cross-wired request for default routines from different context / part"));

    isdeep = (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
              part->storage_mode == EXR_STORAGE_DEEP_TILED)
                 ? 1
                 : 0;

    encode->convert_and_pack_fn = internal_exr_match_encode (encode, isdeep);
    if (part->comp_type != EXR_COMPRESSION_NONE)
        encode->compress_fn = &exr_compress_chunk;
    encode->yield_until_ready_fn = &default_yield;
    encode->write_fn             = &default_write_chunk;

    return EXR_UNLOCK_WRITE_AND_RETURN (EXR_ERR_SUCCESS);
}